

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O1

Result __thiscall
wabt::interp::DefinedFunc::DoCall
          (DefinedFunc *this,Thread *thread,Values *params,Values *results,Ptr *out_trap)

{
  RunResult RVar1;
  Enum EVar2;
  
  if (((long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 -
      ((long)(this->super_Func).type_.params.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->super_Func).type_.params.
             super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
             super__Vector_impl_data._M_start >> 2) == 0) {
    Thread::PushValues(thread,&(this->super_Func).type_.params,params);
    RVar1 = Thread::PushCall(thread,this,out_trap);
    EVar2 = Error;
    if (RVar1 != Trap) {
      do {
        RVar1 = Thread::Run(thread,1000,out_trap);
      } while (RVar1 == Ok);
      if (RVar1 != Trap) {
        Thread::PopValues(thread,&(this->super_Func).type_.results,results);
        EVar2 = Ok;
      }
    }
    return (Result)EVar2;
  }
  __assert_fail("params.size() == type_.params.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/interp/interp.cc"
                ,0x17e,
                "virtual Result wabt::interp::DefinedFunc::DoCall(Thread &, const Values &, Values &, Trap::Ptr *)"
               );
}

Assistant:

Result DefinedFunc::DoCall(Thread& thread,
                           const Values& params,
                           Values& results,
                           Trap::Ptr* out_trap) {
  assert(params.size() == type_.params.size());
  thread.PushValues(type_.params, params);
  RunResult result = thread.PushCall(*this, out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  result = thread.Run(out_trap);
  if (result == RunResult::Trap) {
    return Result::Error;
  }
  thread.PopValues(type_.results, &results);
  return Result::Ok;
}